

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O2

void amrex::average_down(MultiFab *S_fine,MultiFab *S_crse,int scomp,int ncomp,IntVect *ratio)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  Periodicity *period;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 *puVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  double dVar29;
  int facx_1;
  int facx;
  int kk;
  Array4<const_double> local_328;
  FabArray<amrex::FArrayBox> *local_2e8;
  Array4<const_double> local_2e0;
  long local_2a0;
  MFIter mfi_1;
  Box local_234;
  BoxArray crse_S_fine_BA;
  MFIter mfi;
  
  bVar5 = FabArrayBase::is_cell_centered((FabArrayBase *)S_crse);
  BoxArray::BoxArray(&crse_S_fine_BA,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
  BoxArray::coarsen(&crse_S_fine_BA,ratio);
  bVar6 = BoxArray::operator==
                    (&crse_S_fine_BA,
                     &(S_crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
  lVar11 = (long)scomp;
  local_2e8 = &S_crse->super_FabArray<amrex::FArrayBox>;
  if ((bVar6) &&
     (bVar6 = DistributionMapping::operator==
                        (&(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                          distributionMap,
                         &(S_crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                          distributionMap), bVar6)) {
    MFIter::MFIter(&mfi,(FabArrayBase *)S_crse,true);
    uVar13 = (ulong)(uint)ncomp;
    if (ncomp < 1) {
      uVar13 = 0;
    }
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::tilebox((Box *)&local_2e0,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&mfi_1,&S_crse->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_328,&S_fine->super_FabArray<amrex::FArrayBox>,&mfi);
      lVar7 = (long)local_2e0.p._4_4_;
      if (bVar5) {
        for (uVar14 = 0; uVar14 != uVar13; uVar14 = uVar14 + 1) {
          for (iVar10 = (int)local_2e0.jstride; iVar10 <= local_2e0.kstride._4_4_;
              iVar10 = iVar10 + 1) {
            uVar1 = ratio->vect[0];
            uVar2 = ratio->vect[1];
            uVar3 = ratio->vect[2];
            uVar15 = 0;
            if (0 < (int)uVar1) {
              uVar15 = (ulong)uVar1;
            }
            uVar12 = 0;
            if (0 < (int)uVar2) {
              uVar12 = (ulong)uVar2;
            }
            uVar4 = uVar3;
            if ((int)uVar3 < 1) {
              uVar4 = 0;
            }
            for (lVar8 = lVar7; lVar8 <= (int)local_2e0.kstride; lVar8 = lVar8 + 1) {
              if ((int)local_2e0.p <= local_2e0.jstride._4_4_) {
                lVar17 = (long)(int)local_2e0.p;
                iVar22 = (int)local_2e0.p * uVar1;
                do {
                  dVar29 = 0.0;
                  for (uVar20 = 0; uVar20 != uVar4; uVar20 = uVar20 + 1) {
                    for (uVar24 = 0; uVar24 != uVar12; uVar24 = uVar24 + 1) {
                      uVar19 = uVar15;
                      iVar26 = iVar22 - local_328.begin.x;
                      while (bVar6 = uVar19 != 0, uVar19 = uVar19 - 1, bVar6) {
                        dVar29 = dVar29 + (double)local_328.p
                                                  [local_328.nstride * (lVar11 + uVar14) +
                                                   (int)((uVar3 * iVar10 + (int)uVar20) -
                                                        local_328.begin.z) * local_328.kstride +
                                                   (int)(((int)lVar8 * uVar2 + (int)uVar24) -
                                                        local_328.begin.y) * local_328.jstride +
                                                   (long)iVar26];
                        iVar26 = iVar26 + 1;
                      }
                    }
                  }
                  *(double *)
                   (((long)iVar10 - (long)mfi_1.endIndex) * mfi_1.tile_size.vect._0_8_ * 8 +
                    (long)mfi_1.m_fa._M_t.
                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl +
                    mfi_1._24_8_ * (lVar11 + uVar14) * 8 +
                    (lVar8 - mfi_1.beginIndex) * (long)mfi_1.fabArray * 8 +
                   (lVar17 - mfi_1.currentIndex) * 8) =
                       dVar29 * (1.0 / (double)(int)(uVar2 * uVar1 * uVar3));
                  lVar17 = lVar17 + 1;
                  iVar22 = iVar22 + uVar1;
                } while (local_2e0.jstride._4_4_ + 1 != (int)lVar17);
              }
            }
          }
        }
      }
      else {
        lVar8 = (long)(int)local_2e0.p * 8;
        lVar17 = lVar11 * 8;
        for (uVar14 = 0; lVar21 = (long)(int)local_2e0.jstride, uVar14 != uVar13;
            uVar14 = uVar14 + 1) {
          for (; (int)lVar21 <= local_2e0.kstride._4_4_; lVar21 = lVar21 + 1) {
            iVar10 = ratio->vect[0];
            iVar22 = ratio->vect[1];
            puVar9 = (undefined8 *)
                     (local_328.nstride * lVar17 + lVar8 * iVar10 +
                      (lVar7 * iVar22 - (long)local_328.begin.y) * local_328.jstride * 8 +
                      ((long)(ratio->vect[2] * (int)lVar21) - (long)local_328.begin.z) *
                      local_328.kstride * 8 + (long)local_328.begin.x * -8 + (long)local_328.p);
            lVar18 = mfi_1._24_8_ * lVar17 +
                     (lVar7 - mfi_1.beginIndex) * (long)mfi_1.fabArray * 8 +
                     (lVar21 - mfi_1.endIndex) * mfi_1.tile_size.vect._0_8_ * 8 +
                     (long)mfi_1.currentIndex * -8 +
                     (long)mfi_1.m_fa._M_t.
                           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                           .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + lVar8
            ;
            for (lVar27 = lVar7; lVar27 <= (int)local_2e0.kstride; lVar27 = lVar27 + 1) {
              if ((int)local_2e0.p <= local_2e0.jstride._4_4_) {
                lVar23 = 0;
                puVar16 = puVar9;
                do {
                  *(undefined8 *)(lVar18 + lVar23 * 8) = *puVar16;
                  puVar16 = puVar16 + iVar10;
                  lVar23 = lVar23 + 1;
                } while ((local_2e0.jstride._4_4_ - (int)local_2e0.p) + 1 != (int)lVar23);
              }
              puVar9 = (undefined8 *)((long)puVar9 + local_328.jstride * 8 * (long)iVar22);
              lVar18 = lVar18 + (long)mfi_1.fabArray * 8;
            }
          }
          lVar17 = lVar17 + 8;
        }
      }
      MFIter::operator++(&mfi);
      S_crse = (MultiFab *)local_2e8;
    }
    MFIter::~MFIter(&mfi);
  }
  else {
    mfi_1.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    mfi_1.fabArray = (FabArrayBase *)0x0;
    mfi_1.tile_size.vect[0] = 0;
    mfi_1.tile_size.vect[1] = 0;
    mfi_1.tile_size.vect[2] = 0;
    mfi_1.flags = '\0';
    mfi_1._29_3_ = 0;
    mfi_1.currentIndex = 0;
    mfi_1.beginIndex = 0;
    local_328.p = (double *)&PTR__FabFactory_007d2928;
    MultiFab::MultiFab((MultiFab *)&mfi,&crse_S_fine_BA,
                       &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                        distributionMap,ncomp,0,(MFInfo *)&mfi_1,
                       (FabFactory<amrex::FArrayBox> *)&local_328);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mfi_1.tile_size);
    MFIter::MFIter(&mfi_1,(FabArrayBase *)&mfi,true);
    uVar13 = 0;
    if (0 < ncomp) {
      uVar13 = (ulong)(uint)ncomp;
    }
    local_2a0 = lVar11 * 8;
    while( true ) {
      if (mfi_1.endIndex <= mfi_1.currentIndex) break;
      MFIter::tilebox(&local_234,&mfi_1);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&local_328,(FabArray<amrex::FArrayBox> *)&mfi,&mfi_1);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_2e0,&S_fine->super_FabArray<amrex::FArrayBox>,&mfi_1);
      lVar7 = (long)local_234.smallend.vect[1];
      if (bVar5) {
        for (uVar14 = 0; uVar14 != uVar13; uVar14 = uVar14 + 1) {
          for (iVar10 = local_234.smallend.vect[2]; iVar10 <= local_234.bigend.vect[2];
              iVar10 = iVar10 + 1) {
            uVar1 = ratio->vect[0];
            uVar2 = ratio->vect[1];
            uVar3 = ratio->vect[2];
            uVar15 = 0;
            if (0 < (int)uVar1) {
              uVar15 = (ulong)uVar1;
            }
            uVar12 = 0;
            if (0 < (int)uVar2) {
              uVar12 = (ulong)uVar2;
            }
            uVar4 = uVar3;
            if ((int)uVar3 < 1) {
              uVar4 = 0;
            }
            for (lVar8 = lVar7; lVar8 <= local_234.bigend.vect[1]; lVar8 = lVar8 + 1) {
              if (local_234.smallend.vect[0] <= local_234.bigend.vect[0]) {
                lVar17 = (long)local_234.smallend.vect[0];
                iVar22 = local_234.smallend.vect[0] * uVar1;
                do {
                  dVar29 = 0.0;
                  for (uVar20 = 0; uVar20 != uVar4; uVar20 = uVar20 + 1) {
                    for (uVar24 = 0; uVar24 != uVar12; uVar24 = uVar24 + 1) {
                      uVar19 = uVar15;
                      iVar26 = iVar22 - local_2e0.begin.x;
                      while (bVar6 = uVar19 != 0, uVar19 = uVar19 - 1, bVar6) {
                        dVar29 = dVar29 + *(double *)
                                           (local_2e0.nstride * (lVar11 + uVar14) * 8 +
                                            CONCAT44(local_2e0.p._4_4_,(int)local_2e0.p) +
                                            (long)(int)((uVar3 * iVar10 + (int)uVar20) -
                                                       local_2e0.begin.z) *
                                            CONCAT44(local_2e0.kstride._4_4_,(int)local_2e0.kstride)
                                            * 8 + (long)(int)(((int)uVar24 + (int)lVar8 * uVar2) -
                                                             local_2e0.begin.y) *
                                                  CONCAT44(local_2e0.jstride._4_4_,
                                                           (int)local_2e0.jstride) * 8 +
                                           (long)iVar26 * 8);
                        iVar26 = iVar26 + 1;
                      }
                    }
                  }
                  local_328.p
                  [((long)iVar10 - (long)local_328.begin.z) * local_328.kstride +
                   local_328.nstride * uVar14 +
                   (lVar8 - local_328.begin.y) * local_328.jstride + (lVar17 - local_328.begin.x)] =
                       (double)(dVar29 * (1.0 / (double)(int)(uVar2 * uVar1 * uVar3)));
                  lVar17 = lVar17 + 1;
                  iVar22 = iVar22 + uVar1;
                } while (local_234.bigend.vect[0] + 1 != (int)lVar17);
              }
            }
          }
        }
      }
      else {
        lVar8 = (long)local_234.smallend.vect[0] * 8;
        lVar21 = 0;
        lVar17 = local_2a0;
        for (uVar14 = 0; lVar27 = (long)local_234.smallend.vect[2], uVar14 != uVar13;
            uVar14 = uVar14 + 1) {
          for (; (int)lVar27 <= local_234.bigend.vect[2]; lVar27 = lVar27 + 1) {
            iVar10 = ratio->vect[0];
            iVar22 = ratio->vect[1];
            lVar28 = CONCAT44(local_2e0.jstride._4_4_,(int)local_2e0.jstride) * 8;
            puVar9 = (undefined8 *)
                     (local_2e0.nstride * lVar17 + lVar8 * iVar10 +
                      (lVar7 * iVar22 - (long)local_2e0.begin.y) * lVar28 +
                      ((long)(ratio->vect[2] * (int)lVar27) - (long)local_2e0.begin.z) *
                      CONCAT44(local_2e0.kstride._4_4_,(int)local_2e0.kstride) * 8 +
                      (long)local_2e0.begin.x * -8 + CONCAT44(local_2e0.p._4_4_,(int)local_2e0.p));
            lVar23 = (long)local_328.p +
                     local_328.nstride * lVar21 +
                     (lVar7 - local_328.begin.y) * local_328.jstride * 8 +
                     (lVar27 - local_328.begin.z) * local_328.kstride * 8 +
                     (long)local_328.begin.x * -8 + lVar8;
            for (lVar18 = lVar7; lVar18 <= local_234.bigend.vect[1]; lVar18 = lVar18 + 1) {
              if (local_234.smallend.vect[0] <= local_234.bigend.vect[0]) {
                lVar25 = 0;
                puVar16 = puVar9;
                do {
                  *(undefined8 *)(lVar23 + lVar25 * 8) = *puVar16;
                  puVar16 = puVar16 + iVar10;
                  lVar25 = lVar25 + 1;
                } while ((local_234.bigend.vect[0] - local_234.smallend.vect[0]) + 1 != (int)lVar25)
                ;
              }
              puVar9 = (undefined8 *)((long)puVar9 + lVar28 * iVar22);
              lVar23 = lVar23 + local_328.jstride * 8;
            }
          }
          lVar17 = lVar17 + 8;
          lVar21 = lVar21 + 8;
        }
      }
      MFIter::operator++(&mfi_1);
      S_crse = (MultiFab *)local_2e8;
    }
    MFIter::~MFIter(&mfi_1);
    period = Periodicity::NonPeriodic();
    FabArray<amrex::FArrayBox>::ParallelCopy
              (&S_crse->super_FabArray<amrex::FArrayBox>,(FabArray<amrex::FArrayBox> *)&mfi,0,scomp,
               ncomp,period,COPY);
    MultiFab::~MultiFab((MultiFab *)&mfi);
  }
  BoxArray::~BoxArray(&crse_S_fine_BA);
  return;
}

Assistant:

void average_down (const MultiFab& S_fine, MultiFab& S_crse,
                       int scomp, int ncomp, const IntVect& ratio)
    {
        BL_PROFILE("amrex::average_down");
        AMREX_ASSERT(S_crse.nComp() == S_fine.nComp());
        AMREX_ASSERT((S_crse.is_cell_centered() && S_fine.is_cell_centered()) ||
                     (S_crse.is_nodal()         && S_fine.is_nodal()));

        bool is_cell_centered = S_crse.is_cell_centered();

        //
        // Coarsen() the fine stuff on processors owning the fine data.
        //
        BoxArray crse_S_fine_BA = S_fine.boxArray(); crse_S_fine_BA.coarsen(ratio);

        if (crse_S_fine_BA == S_crse.boxArray() && S_fine.DistributionMap() == S_crse.DistributionMap())
        {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && S_crse.isFusingCandidate()) {
                auto const& crsema = S_crse.arrays();
                auto const& finema = S_fine.const_arrays();
                if (is_cell_centered) {
                    ParallelFor(S_crse, IntVect(0), ncomp,
                    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                    {
                        amrex_avgdown(i,j,k,n,crsema[box_no],finema[box_no],scomp,scomp,ratio);
                    });
                } else {
                    ParallelFor(S_crse, IntVect(0), ncomp,
                    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                    {
                        amrex_avgdown_nodes(i,j,k,n,crsema[box_no],finema[box_no],scomp,scomp,ratio);
                    });
                }
                Gpu::streamSynchronize();
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(S_crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    //  NOTE: The tilebox is defined at the coarse level.
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& crsearr = S_crse.array(mfi);
                    Array4<Real const> const& finearr = S_fine.const_array(mfi);

                    if (is_cell_centered) {
                        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                        {
                            amrex_avgdown(i,j,k,n,crsearr,finearr,scomp,scomp,ratio);
                        });
                    } else {
                        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                        {
                            amrex_avgdown_nodes(i,j,k,n,crsearr,finearr,scomp,scomp,ratio);
                        });
                    }
                }
            }
        }
        else
        {
            MultiFab crse_S_fine(crse_S_fine_BA, S_fine.DistributionMap(), ncomp, 0, MFInfo(), FArrayBoxFactory());

#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && crse_S_fine.isFusingCandidate()) {
                auto const& crsema = crse_S_fine.arrays();
                auto const& finema = S_fine.const_arrays();
                if (is_cell_centered) {
                    ParallelFor(crse_S_fine, IntVect(0), ncomp,
                    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                    {
                        amrex_avgdown(i,j,k,n,crsema[box_no],finema[box_no],0,scomp,ratio);
                    });
                } else {
                    ParallelFor(crse_S_fine, IntVect(0), ncomp,
                    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                    {
                        amrex_avgdown_nodes(i,j,k,n,crsema[box_no],finema[box_no],0,scomp,ratio);
                    });
                }
                Gpu::streamSynchronize();
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(crse_S_fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    //  NOTE: The tilebox is defined at the coarse level.
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& crsearr = crse_S_fine.array(mfi);
                    Array4<Real const> const& finearr = S_fine.const_array(mfi);

                    //  NOTE: We copy from component scomp of the fine fab into component 0 of the crse fab
                    //        because the crse fab is a temporary which was made starting at comp 0, it is
                    //        not part of the actual crse multifab which came in.

                    if (is_cell_centered) {
                        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                        {
                            amrex_avgdown(i,j,k,n,crsearr,finearr,0,scomp,ratio);
                        });
                    } else {
                        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                        {
                            amrex_avgdown_nodes(i,j,k,n,crsearr,finearr,0,scomp,ratio);
                        });
                    }
                }
            }

            S_crse.ParallelCopy(crse_S_fine,0,scomp,ncomp);
        }
   }